

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_flechette.cpp
# Opt level: O2

int AF_A_PoisonBagDamage(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  int iVar2;
  DObject *this;
  bool bVar3;
  AActor *bombsource;
  AActor *bombspot;
  char *__assertion;
  double dVar4;
  FName local_1c;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0053afbd;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    bombspot = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (bombspot == (AActor *)0x0) {
LAB_0053aec3:
        bombspot = (AActor *)0x0;
      }
      else {
        bVar3 = DObject::IsKindOf((DObject *)bombspot,AActor::RegistrationInfo.MyClass);
        if (!bVar3) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0053afbd;
        }
      }
      if (numparam == 1) goto LAB_0053af43;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0053afad;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar3) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0053afbd;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0053afad;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0053af43:
        bombsource = GC::ReadBarrier<AActor>((AActor **)&bombspot->target);
        local_1c.Index = (bombspot->DamageType).super_FName.Index;
        P_RadiusAttack(bombspot,bombsource,4,0x28,&local_1c,1,0);
        iVar2 = bombspot->special2;
        dVar4 = BobSin((double)iVar2);
        (bombspot->__Pos).Z = dVar4 * 0.0625 + (bombspot->__Pos).Z;
        bombspot->special2 = iVar2 + 1U & 0x3f;
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0053afbd;
    }
    if (bombspot == (AActor *)0x0) goto LAB_0053aec3;
  }
LAB_0053afad:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0053afbd:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_flechette.cpp"
                ,0x196,"int AF_A_PoisonBagDamage(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_PoisonBagDamage)
{
	PARAM_ACTION_PROLOGUE;

	int bobIndex;
	
	P_RadiusAttack (self, self->target, 4, 40, self->DamageType, RADF_HURTSOURCE);
	bobIndex = self->special2;
	self->AddZ(BobSin(bobIndex) / 16);
	self->special2 = (bobIndex + 1) & 63;
	return 0;
}